

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * __thiscall
kj::_::Debug::makeDescription<char_const(&)[18],capnp::Text::Reader>
          (String *__return_storage_ptr__,Debug *this,char *macroArgs,char (*params) [18],
          Reader *params_1)

{
  Reader *params_00;
  long lVar1;
  ArrayPtr<kj::String> argValues_00;
  String argValues [2];
  
  str<char_const(&)[18]>(argValues,(kj *)macroArgs,(char (*) [18])macroArgs);
  str<capnp::Text::Reader&>(argValues + 1,(kj *)params,params_00);
  argValues_00.size_ = 2;
  argValues_00.ptr = argValues;
  makeDescriptionInternal(__return_storage_ptr__,(char *)this,argValues_00);
  lVar1 = 0x18;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}